

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

void __thiscall Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,int16_t v)

{
  allocator_type local_11;
  
  this->type = 'Y';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data,2,&local_11);
  *(int16_t *)
   (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = v;
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(int16_t v)
: type('Y')
, data(2) {
    uint8_t* d = data.data();
    (reinterpret_cast<int16_t*>(d))[0] = v;
}